

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

void __thiscall hta::Metric::insert(Metric *this,TimeValue tv)

{
  Duration interval;
  double minimum;
  Aggregate other;
  Row row;
  Level *this_00;
  out_of_range *poVar1;
  long *plVar2;
  size_type *psVar3;
  duration __val;
  long lVar4;
  type partial_duration;
  Aggregate partial_interval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  Metric *local_108;
  undefined1 local_100 [32];
  Value local_e0;
  Duration DStack_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  rep local_70;
  long lStack_68;
  Value local_60;
  Value VStack_58;
  Value local_50;
  uint64_t uStack_48;
  Value local_40;
  rep rStack_38;
  
  __val.__r = (rep)tv.time.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r;
  minimum = tv.value;
  check_write(this);
  if ((duration)__val.__r == (duration)0x0) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar1,"cannot insert invalid (0) hta::TimePoint");
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (__val.__r <=
      (this->previous_time_).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              (&local_b0,
               (this->previous_time_).
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
    std::operator+(&local_90,"trying to add non-monotonic timestamp; previous ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_128._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_128._M_dataplus._M_p == psVar3) {
      local_128.field_2._M_allocated_capacity = *psVar3;
      local_128.field_2._8_8_ = plVar2[3];
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar3;
    }
    local_128._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string(&local_d0,__val.__r);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
    std::out_of_range::out_of_range(poVar1,(string *)local_100);
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  (this->previous_time_).
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       __val.__r;
  interval.__r = (this->interval_min_).__r;
  this_00 = get_level(this,interval);
  (*((this->storage_metric_)._M_t.
     super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
     super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
     super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[2])
            (tv.value._0_4_);
  if ((this_00->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r == 0) {
    (this_00->time_current).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = __val.__r;
  }
  lVar4 = (this_00->time_current).
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r + interval.__r;
  local_108 = this;
  if (-1 < lVar4) {
    lVar4 = lVar4 - lVar4 % interval.__r;
    if (lVar4 <= __val.__r) {
      do {
        local_128._M_dataplus._M_p =
             (pointer)(lVar4 - (this_00->time_current).
                               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               .__d.__r);
        if (interval.__r < (long)local_128._M_dataplus._M_p) {
          __assert_fail("partial_duration <= interval",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                        ,0x21f,"void hta::Metric::insert(TimeValue)");
        }
        Aggregate::Aggregate
                  ((Aggregate *)local_100,minimum,minimum,0.0,0,
                   (double)(long)local_128._M_dataplus._M_p * minimum,(Duration *)&local_128);
        if (lVar4 < (this_00->time_current).
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r) {
          __assert_fail("ta.time >= time_current",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/level.hpp"
                        ,0x39,"void hta::Level::advance(TimeAggregate)");
        }
        other.maximum = (Value)local_100._8_8_;
        other.minimum = (Value)local_100._0_8_;
        other.sum = (Value)local_100._16_8_;
        other.count = local_100._24_8_;
        other.integral = local_e0;
        other.active_time.__r = DStack_d8.__r;
        Aggregate::operator+=(&this_00->aggregate,other);
        (this_00->time_current).
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = lVar4;
        lStack_68 = lVar4 - interval.__r;
        local_60 = (this_00->aggregate).minimum;
        VStack_58 = (this_00->aggregate).maximum;
        local_50 = (this_00->aggregate).sum;
        uStack_48 = (this_00->aggregate).count;
        local_40 = (this_00->aggregate).integral;
        rStack_38 = (this_00->aggregate).active_time.__r;
        row.time.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               lStack_68;
        row.interval.__r = interval.__r;
        row.aggregate.minimum = local_60;
        row.aggregate.maximum = VStack_58;
        row.aggregate.sum = local_50;
        row.aggregate.count = uStack_48;
        row.aggregate.integral = local_40;
        row.aggregate.active_time.__r = rStack_38;
        local_70 = interval.__r;
        insert(local_108,row);
        (this_00->time_current).
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = lVar4;
        (this_00->aggregate).minimum = INFINITY;
        (this_00->aggregate).maximum = -INFINITY;
        (this_00->aggregate).integral = 0.0;
        (this_00->aggregate).active_time.__r = 0;
        (this_00->aggregate).sum = 0.0;
        (this_00->aggregate).count = 0;
        lVar4 = lVar4 + interval.__r;
        if (lVar4 < 0) goto LAB_00179298;
        lVar4 = lVar4 - lVar4 % interval.__r;
      } while (lVar4 <= __val.__r);
    }
    Level::advance(this_00,tv);
    return;
  }
LAB_00179298:
  __assert_fail("time.time_since_epoch().count() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
}

Assistant:

void Metric::insert(TimeValue tv)
{
    check_write();
    // Evaluate if these two consistency checks hurt performance
    // Must not have an "invalid" time value... who knows what would happen...
    if (!tv.time)
    {
        throw std::out_of_range("cannot insert invalid (0) hta::TimePoint");
    }
    if (tv.time <= previous_time_)
    {
        throw std::out_of_range("trying to add non-monotonic timestamp; previous " +
                                std::to_string(previous_time_.time_since_epoch().count()) +
                                " new " + std::to_string(tv.time.time_since_epoch().count()));
    }
    previous_time_ = tv.time;

    const auto interval = interval_min_;
    auto& level = get_level(interval);
    // We must do this after get_level, otherwise it confuses the level restore
    storage_metric_->insert(tv);

    if (!level.time_current)
    {
        // level.time_current = interval_begin(tv.time, interval);
        level.time_current = tv.time;
    }
    auto level_time_end = interval_end(level.time_current, interval);
    while (tv.time >= level_time_end)
    {
        // the point doesn't belong in the current interval,
        // but some of it's integral may..
        auto partial_duration = level_time_end - level.time_current;
        assert(partial_duration <= interval);
        // TODO move this into a clever method of Aggregate itself
        Aggregate partial_interval{
            tv.value, tv.value, 0, 0, tv.value * partial_duration.count(), partial_duration
        };
        level.advance({ level_time_end, partial_interval });

        auto level_time_begin = level_time_end - interval;

        // Inform higher levels of this new closed level
        insert({ interval, level_time_begin, level.aggregate });

        // reset the interval at lowest level
        level = Level(level_time_end);
        level_time_end = interval_end(level.time_current, interval);
    }
    level.advance(tv);
}